

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O2

int __thiscall Layer_c_api::forward(Layer_c_api *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  ncnn_mat_t top_blob0;
  Mat *local_20;
  
  local_20 = (Mat *)0x0;
  iVar1 = (*this->layer->forward_1)
                    (this->layer,(ncnn_mat_t)bottom_blob,(ncnn_mat_t *)&local_20,(ncnn_option_t)opt)
  ;
  ncnn::Mat::operator=(top_blob,local_20);
  ncnn_mat_destroy((ncnn_mat_t)local_20);
  return iVar1;
}

Assistant:

virtual int forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
    {
        ncnn_mat_t top_blob0 = 0;
        int ret = layer->forward_1(layer, (ncnn_mat_t)&bottom_blob, &top_blob0, (ncnn_option_t)&opt);
        top_blob = *(Mat*)top_blob0;
        ncnn_mat_destroy(top_blob0);
        return ret;
    }